

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recursive_maximum_likelihood_parameter_generation.cc
# Opt level: O2

void __thiscall
sptk::RecursiveMaximumLikelihoodParameterGeneration::RecursiveMaximumLikelihoodParameterGeneration
          (RecursiveMaximumLikelihoodParameterGeneration *this,int num_order,int num_past_frame,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *window_coefficients,InputSourceInterface *input_source)

{
  pointer pdVar1;
  pointer pdVar2;
  int iVar3;
  pointer pdVar4;
  int i;
  int iVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  pointer this_00;
  double local_38;
  
  (this->super_InputSourceInterface)._vptr_InputSourceInterface =
       (_func_int **)&PTR__RecursiveMaximumLikelihoodParameterGeneration_00118bd0;
  this->num_order_ = num_order;
  this->num_past_frame_ = num_past_frame;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&this->window_coefficients_,window_coefficients);
  this->input_source_ = input_source;
  this->is_valid_ = true;
  memset(&this->buffer_,0,0xa8);
  if ((((input_source != (InputSourceInterface *)0x0) && (-1 < this->num_order_)) &&
      (-1 < this->num_past_frame_)) &&
     (iVar3 = (*input_source->_vptr_InputSourceInterface[3])(input_source), (char)iVar3 != '\0')) {
    iVar3 = 0;
    for (this_00 = (this->window_coefficients_).
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        this_00 !=
        (this->window_coefficients_).
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish; this_00 = this_00 + 1) {
      uVar6 = (long)(this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start;
      if (((uint)uVar6 >> 3 & 1) == 0) {
        local_38 = 0.0;
        std::vector<double,_std::allocator<double>_>::emplace_back<double>(this_00,&local_38);
      }
      uVar6 = uVar6 >> 3;
      iVar5 = (int)((long)((ulong)(uint)((int)uVar6 >> 0x1f) << 0x20 | uVar6 & 0xffffffff) / 2);
      if (iVar3 <= iVar5) {
        iVar3 = iVar5;
      }
    }
    iVar5 = this->num_past_frame_;
    if (iVar3 <= iVar5) {
      iVar3 = iVar3 + iVar5 + 1;
      this->calculation_field_ = iVar3;
      this->num_remaining_frame_ = iVar3;
      this->current_frame_ = iVar5;
      for (iVar5 = 1; iVar5 < iVar3; iVar5 = iVar5 + 1) {
        iVar3 = (*input_source->_vptr_InputSourceInterface[4])(input_source,&this->buffer_);
        if ((char)iVar3 == '\0') {
          pdVar1 = (this->buffer_).static_and_dynamic_parameters.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar2 = (this->buffer_).static_and_dynamic_parameters.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          lVar7 = (long)(int)((ulong)((long)pdVar2 - (long)pdVar1) >> 4);
          pdVar4 = pdVar1 + lVar7;
          for (lVar8 = 0; lVar7 * 8 != lVar8; lVar8 = lVar8 + 8) {
            *(undefined8 *)((long)pdVar1 + lVar8) = 0;
          }
          for (; pdVar4 != pdVar2; pdVar4 = pdVar4 + 1) {
            *pdVar4 = 1.79769313486232e+308;
          }
          this->num_remaining_frame_ = this->num_remaining_frame_ + -1;
        }
        Forward(this);
        iVar3 = this->calculation_field_;
      }
      return;
    }
  }
  this->is_valid_ = false;
  return;
}

Assistant:

RecursiveMaximumLikelihoodParameterGeneration::
    RecursiveMaximumLikelihoodParameterGeneration(
        int num_order, int num_past_frame,
        const std::vector<std::vector<double> >& window_coefficients,
        InputSourceInterface* input_source)
    : num_order_(num_order),
      num_past_frame_(num_past_frame),
      window_coefficients_(window_coefficients),
      input_source_(input_source),
      is_valid_(true) {
  if (num_order_ < 0 || num_past_frame_ < 0 || NULL == input_source_ ||
      !input_source_->IsValid()) {
    is_valid_ = false;
    return;
  }

  int max_half_window_width(0);
  for (std::vector<std::vector<double> >::iterator itr(
           window_coefficients_.begin());
       itr != window_coefficients_.end(); ++itr) {
    const int window_width(static_cast<int>(itr->size()));
    if (0 == window_width % 2) {
      itr->push_back(0.0);
    }
    const int half_window_width(window_width / 2);
    if (max_half_window_width < half_window_width) {
      max_half_window_width = half_window_width;
    }
  }

  if (num_past_frame_ < max_half_window_width) {
    is_valid_ = false;
    return;
  }

  // calculation_field is past + present + future.
  calculation_field_ = num_past_frame_ + 1 + max_half_window_width;
  num_remaining_frame_ = calculation_field_;
  current_frame_ = num_past_frame_;

  for (int i(1); i < calculation_field_; ++i) {
    if (!input_source->Get(&buffer_.static_and_dynamic_parameters)) {
      const int static_and_dynamic_size(
          static_cast<int>(buffer_.static_and_dynamic_parameters.size() / 2));
      // Initialize with zero mean.
      std::fill(buffer_.static_and_dynamic_parameters.begin(),
                buffer_.static_and_dynamic_parameters.begin() +
                    static_and_dynamic_size,
                0.0);
      // Initialize with infinite variance.
      std::fill(buffer_.static_and_dynamic_parameters.begin() +
                    static_and_dynamic_size,
                buffer_.static_and_dynamic_parameters.end(), kInf);
      --num_remaining_frame_;
    }
    Forward();
  }
}